

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O1

Tape * __thiscall
njoy::ENDFtk::tree::Tape::parse(Tape *__return_storage_ptr__,Tape *this,long *lineNumber)

{
  string content;
  iterator end;
  iterator position;
  string local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  content_abi_cxx11_(&local_48,this);
  local_20._M_current = local_48._M_dataplus._M_p;
  local_28._M_current = local_48._M_dataplus._M_p + local_48._M_string_length;
  ENDFtk::Tape::Tape<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (__return_storage_ptr__,&local_20,&local_28,lineNumber);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

::njoy::ENDFtk::Tape parse( long& lineNumber ) const {

  std::string content = this->content();
  auto position = content.begin();
  auto end = content.end();

  return { position, end, lineNumber };
}